

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall
DIntermissionScreenCast::Init(DIntermissionScreenCast *this,FIntermissionAction *desc,bool first)

{
  uint uVar1;
  FICastSound *pFVar2;
  AActor *pAVar3;
  int iVar4;
  PClass *pPVar5;
  PClassActor *pPVar6;
  FRemapTablePtr *pFVar7;
  ulong uVar8;
  long lVar9;
  FSoundID local_30;
  FName local_2c;
  
  DIntermissionScreen::Init(&this->super_DIntermissionScreen,desc,first);
  this->mName = (char *)desc[1]._vptr_FIntermissionAction;
  local_2c.Index = desc[1].mSize;
  pPVar5 = PClass::FindClass(&local_2c);
  pPVar6 = dyn_cast<PClassActor>((DObject *)pPVar5);
  this->mClass = pPVar6;
  if (pPVar6 == (PClassActor *)0x0) {
    this->mDefaults = (AActor *)0x0;
    this->caststate = (FState *)0x0;
    return;
  }
  this->mDefaults = (AActor *)(pPVar6->super_PClass).Defaults;
  TArray<FICastSound,_FICastSound>::Resize
            (&this->mCastSounds,*(uint *)((long)&desc[1].mMusic.Chars + 4));
  if ((this->mCastSounds).Count != 0) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      pPVar5 = desc[1].mClass;
      pFVar2 = (this->mCastSounds).Array;
      pFVar2[uVar8].mSequence =
           *(BYTE *)((long)&(pPVar5->super_PNativeStruct).super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.super_PTypeBase.super_DObject + lVar9);
      pFVar2[uVar8].mIndex =
           *(BYTE *)((long)&(pPVar5->super_PNativeStruct).super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                    lVar9 + 1);
      iVar4 = S_FindSound(*(char **)((long)&(pPVar5->super_PNativeStruct).super_PStruct.
                                            super_PNamedType.super_PCompoundType.super_PType.
                                            super_PTypeBase.super_DObject + lVar9 + 8));
      pFVar2[uVar8].mSound.ID = iVar4;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (this->mCastSounds).Count);
  }
  pPVar6 = this->mClass;
  pAVar3 = this->mDefaults;
  this->caststate = pAVar3->SeeState;
  if (pPVar6 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) {
LAB_0030118f:
    this->advplayerstate = pAVar3->MissileState;
    uVar8 = (ulong)consoleplayer;
    pFVar7 = translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array;
  }
  else {
    do {
      pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
      if (pPVar6 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) break;
    } while (pPVar6 != (PClassActor *)0x0);
    if (pPVar6 != (PClassActor *)0x0) goto LAB_0030118f;
    this->advplayerstate = (FState *)0x0;
    this->casttranslation = (FRemapTable *)0x0;
    uVar1 = pAVar3->Translation;
    if (uVar1 == 0) goto LAB_003011ba;
    uVar8 = (ulong)(ushort)uVar1;
    pFVar7 = *(FRemapTablePtr **)
              ((long)&translationtables[0].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array +
              (ulong)(uVar1 >> 0xc & 0xff0));
  }
  this->casttranslation = pFVar7[uVar8].Ptr;
LAB_003011ba:
  this->castdeath = false;
  this->castattacking = false;
  this->castframes = 0;
  this->castonmelee = 0;
  local_30.ID = (pAVar3->SeeSound).super_FSoundID.ID;
  if (local_30.ID != 0) {
    S_Sound(0x22,&local_30,1.0,0.0);
  }
  return;
}

Assistant:

void DIntermissionScreenCast::Init(FIntermissionAction *desc, bool first)
{
	Super::Init(desc, first);
	mName = static_cast<FIntermissionActionCast*>(desc)->mName;
	mClass = PClass::FindActor(static_cast<FIntermissionActionCast*>(desc)->mCastClass);
	if (mClass != NULL) mDefaults = GetDefaultByType(mClass);
	else
	{
		mDefaults = NULL;
		caststate = NULL;
		return;
	}

	mCastSounds.Resize(static_cast<FIntermissionActionCast*>(desc)->mCastSounds.Size());
	for (unsigned i=0; i < mCastSounds.Size(); i++)
	{
		mCastSounds[i].mSequence = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mSequence;
		mCastSounds[i].mIndex = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mIndex;
		mCastSounds[i].mSound = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mSound;
	}
	caststate = mDefaults->SeeState;
	if (mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
	{
		advplayerstate = mDefaults->MissileState;
		casttranslation = translationtables[TRANSLATION_Players][consoleplayer];
	}
	else
	{
		advplayerstate = NULL;
		casttranslation = NULL;
		if (mDefaults->Translation != 0)
		{
			casttranslation = translationtables[GetTranslationType(mDefaults->Translation)]
												[GetTranslationIndex(mDefaults->Translation)];
		}
	}
	castdeath = false;
	castframes = 0;
	castonmelee = 0;
	castattacking = false;
	if (mDefaults->SeeSound)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, mDefaults->SeeSound, 1, ATTN_NONE);
	}
}